

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t x;
  ushort x_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint pos;
  uint64_t uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar8 = 0;
  pos = 0;
  do {
    uVar7 = uVar8 & 0xffff;
    while( true ) {
      if ((iVar1 <= (int)pos) || (iVar2 <= (int)uVar8)) {
        return 0;
      }
      uVar3 = pos & 0xffff;
      x = (x1->high_low_container).keys[uVar3];
      x_00 = (x2->high_low_container).keys[uVar7];
      if (x == x_00) {
        bVar5 = (x1->high_low_container).typecodes[uVar3];
        if (bVar5 == 4) {
          bVar5 = *(byte *)((long)(x1->high_low_container).containers[uVar3] + 8);
        }
        bVar6 = (x2->high_low_container).typecodes[uVar7];
        if (bVar6 == 4) {
          bVar6 = *(byte *)((long)(x2->high_low_container).containers[uVar7] + 8);
        }
        uVar4 = (*(code *)(&DAT_0012041c +
                          *(int *)(&DAT_0012041c + (ulong)(((uint)bVar6 + (uint)bVar5 * 4) - 5) * 4)
                          ))();
        return uVar4;
      }
      if (x_00 <= x) break;
      pos = ra_advance_until(&x1->high_low_container,x_00,pos);
    }
    uVar3 = ra_advance_until(&x2->high_low_container,x,(int)uVar8);
    uVar8 = (ulong)uVar3;
  } while( true );
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}